

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96_test.c
# Opt level: O3

void brngCTRXStepR(void *buf,size_t count,void *stack)

{
  long lVar1;
  ulong count_00;
  long lVar2;
  size_t count_01;
  void *dest;
  
  if (count != 0) {
    lVar2 = *(long *)((long)stack + 0x10);
    count_01 = count;
    dest = buf;
    do {
      count_00 = *(long *)((long)stack + 8) - lVar2;
      if (count_01 < count_00) {
        memCopy(dest,(void *)(lVar2 + *stack),count_01);
        *(long *)((long)stack + 0x10) = *(long *)((long)stack + 0x10) + count_01;
        break;
      }
      memCopy(dest,(void *)(lVar2 + *stack),count_00);
      lVar1 = *(long *)((long)stack + 8) - *(long *)((long)stack + 0x10);
      dest = (void *)((long)dest + lVar1);
      *(undefined8 *)((long)stack + 0x10) = 0;
      lVar2 = 0;
      count_01 = count_01 - lVar1;
    } while (count_01 != 0);
  }
  brngCTRStepR(buf,count,(void *)((long)stack + 0x18));
  return;
}

Assistant:

static void brngCTRXStepR(void* buf, size_t count, void* stack)
{
	brng_ctrx_st* s = (brng_ctrx_st*)stack;
	octet* buf1 = (octet*)buf;
	size_t count1 = count;
	ASSERT(memIsValid(s, sizeof(brng_ctrx_st)));
	// заполнить buf
	while (count1)
		if (count1 < s->count - s->offset)
		{
			memCopy(buf1, s->X + s->offset, count1);
			s->offset += count1;
			count1 = 0;
		}
		else
		{
			memCopy(buf1, s->X + s->offset, s->count - s->offset);
			buf1 += s->count - s->offset;
			count1 -= s->count - s->offset;
			s->offset = 0;
		}
	// сгенерировать
	brngCTRStepR(buf, count, s->state_ex);
}